

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

text * __thiscall lest::env::sections_abi_cxx11_(text *__return_storage_ptr__,env *this)

{
  pointer pbVar1;
  pointer pbVar2;
  text msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> section;
  pointer local_98;
  size_type local_90;
  char local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  text *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->opt).verbose == false) {
    std::__cxx11::string::string((string *)&local_98,"",(allocator *)&local_70);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_98 == &local_88) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_87,local_88);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_80;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_98;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_87,local_88);
    }
    __return_storage_ptr__->_M_string_length = local_90;
  }
  else {
    local_98 = &local_88;
    local_90 = 0;
    local_88 = '\0';
    pbVar1 = (this->ctx).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_78 = __return_storage_ptr__;
    for (pbVar2 = (this->ctx).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1)
    {
      std::__cxx11::string::string((string *)&local_70,(string *)pbVar2);
      std::operator+(&local_50,"\n  ",&local_70);
      std::__cxx11::string::append((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    (local_78->_M_dataplus)._M_p = (pointer)&local_78->field_2;
    if (local_98 == &local_88) {
      (local_78->field_2)._M_allocated_capacity = CONCAT71(uStack_87,local_88);
      *(undefined8 *)((long)&local_78->field_2 + 8) = uStack_80;
    }
    else {
      (local_78->_M_dataplus)._M_p = local_98;
      (local_78->field_2)._M_allocated_capacity = CONCAT71(uStack_87,local_88);
    }
    local_78->_M_string_length = local_90;
    __return_storage_ptr__ = local_78;
  }
  local_98 = &local_88;
  local_90 = 0;
  local_88 = '\0';
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

text sections()
    {
        if ( ! opt.verbose )
            return "";

        text msg;
        for( auto section : ctx )
        {
            msg += "\n  " + section;
        }
        return msg;
    }